

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O0

bool __thiscall
cmCTestRunTest::ForkProcess
          (cmCTestRunTest *this,cmDuration testTimeOut,bool explicitTimeout,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *environment,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *environment_modification,vector<unsigned_long,_std::allocator<unsigned_long>_> *affinity)

{
  size_t *this_00;
  cmCTest *this_01;
  byte bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  pointer pcVar5;
  ostream *poVar6;
  char *msg;
  reference envmod_00;
  long lVar7;
  string *this_02;
  byte local_4fb;
  bool local_4fa;
  bool local_4f9;
  string local_4f0 [32];
  reference local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *var;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  envLog;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *envmod;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_468 [7];
  bool env_ok;
  EnvDiff diff_1;
  EnvDiff diff;
  ostringstream envMeasurement;
  undefined1 local_290 [8];
  SaveRestoreEnvironment sre;
  string local_270 [48];
  ostringstream local_240 [8];
  ostringstream cmCTestLog_msg;
  duration<double,_std::ratio<1L,_1L>_> local_c0;
  int local_b4;
  duration<long,_std::ratio<1L,_1L>_> local_b0;
  cmCTestRunTest *local_a8;
  duration<double,_std::ratio<1L,_1L>_> local_a0;
  duration<double,_std::ratio<1L,_1L>_> local_98;
  duration<double,_std::ratio<1L,_1L>_> local_90;
  rep_conflict local_88;
  duration<double,_std::ratio<1L,_1L>_> local_80;
  duration<double,_std::ratio<1L,_1L>_> local_78;
  duration<double,_std::ratio<1L,_1L>_> local_70;
  int local_64;
  duration<long,_std::ratio<60L,_1L>_> local_60;
  duration<double,_std::ratio<1L,_1L>_> local_58;
  duration<double,_std::ratio<1L,_1L>_> local_50;
  duration<double,_std::ratio<1L,_1L>_> local_48;
  cmDuration timeout;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *affinity_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *environment_modification_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *environment_local;
  bool explicitTimeout_local;
  cmCTestRunTest *this_local;
  cmDuration testTimeOut_local;
  
  timeout.__r = (rep_conflict)affinity;
  this_local = (cmCTestRunTest *)testTimeOut.__r;
  pcVar5 = std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::operator->
                     (&this->TestProcess);
  cmProcess::SetId(pcVar5,this->Index);
  pcVar5 = std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::operator->
                     (&this->TestProcess);
  cmProcess::SetWorkingDirectory(pcVar5,&this->TestProperties->Directory);
  pcVar5 = std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::operator->
                     (&this->TestProcess);
  cmProcess::SetCommand(pcVar5,&this->ActualCommand);
  pcVar5 = std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::operator->
                     (&this->TestProcess);
  cmProcess::SetCommandArguments(pcVar5,&this->Arguments);
  local_48.__r = (rep_conflict)cmCTest::GetRemainingTimeAllowed(this->CTest);
  local_50.__r = (rep_conflict)cmCTest::MaxDuration();
  bVar2 = std::chrono::operator!=(&local_48,&local_50);
  if (bVar2) {
    local_64 = 2;
    std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
              ((duration<long,std::ratio<60l,1l>> *)&local_60,&local_64);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<60l,1l>,void>
              ((duration<double,std::ratio<1l,1l>> *)&local_58,&local_60);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator-=(&local_48,&local_58);
  }
  local_70.__r = (rep_conflict)cmCTest::GetTimeOut(this->CTest);
  local_78 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
  bVar2 = std::chrono::operator>(&local_70,&local_78);
  local_4f9 = false;
  if (bVar2) {
    local_80.__r = (rep_conflict)cmCTest::GetTimeOut(this->CTest);
    local_4f9 = std::chrono::operator<(&local_80,&local_48);
  }
  if (local_4f9 != false) {
    local_88 = (rep_conflict)cmCTest::GetTimeOut(this->CTest);
    local_48.__r = local_88;
  }
  local_90 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
  bVar2 = std::chrono::operator>((duration<double,_std::ratio<1L,_1L>_> *)&this_local,&local_90);
  local_4fa = false;
  if (bVar2) {
    local_98.__r = (rep_conflict)cmCTest::GetRemainingTimeAllowed(this->CTest);
    local_4fa = std::chrono::operator<
                          ((duration<double,_std::ratio<1L,_1L>_> *)&this_local,&local_98);
  }
  if (local_4fa != false) {
    local_48.__r = (rep_conflict)this_local;
  }
  local_a0 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
  bVar2 = std::chrono::operator<=(&local_48,&local_a0);
  if (bVar2) {
    local_b4 = 1;
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1l>> *)&local_b0,&local_b4);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1l>,void>
              ((duration<double,std::ratio<1l,1l>> *)&local_a8,&local_b0);
    local_48.__r = (rep_conflict)local_a8;
  }
  local_c0 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
  bVar2 = std::chrono::operator==((duration<double,_std::ratio<1L,_1L>_> *)&this_local,&local_c0);
  local_4fb = 0;
  bVar1 = explicitTimeout;
  if (!bVar2) {
    bVar1 = local_4fb;
  }
  local_4fb = bVar1;
  if ((local_4fb & 1) != 0) {
    local_48 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
  }
  std::__cxx11::ostringstream::ostringstream(local_240);
  poVar6 = (ostream *)std::ostream::operator<<(local_240,this->Index);
  poVar6 = std::operator<<(poVar6,": ");
  poVar6 = std::operator<<(poVar6,"Test timeout computed to be: ");
  uVar4 = cmDurationTo<unsigned_int>(&local_48);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar4);
  std::operator<<(poVar6,"\n");
  this_01 = this->CTest;
  std::__cxx11::ostringstream::str();
  msg = (char *)std::__cxx11::string::c_str();
  bVar2 = cmCTestGenericHandler::GetQuiet(&this->TestHandler->super_cmCTestGenericHandler);
  cmCTest::Log(this_01,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x30e,msg,bVar2);
  std::__cxx11::string::~string(local_270);
  std::__cxx11::ostringstream::~ostringstream(local_240);
  pcVar5 = std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::operator->
                     (&this->TestProcess);
  sre.Env.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_48.__r;
  cmProcess::SetTimeout(pcVar5,(cmDuration)local_48.__r);
  cmSystemTools::SaveRestoreEnvironment::SaveRestoreEnvironment((SaveRestoreEnvironment *)local_290)
  ;
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)&diff.diff._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if ((environment !=
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0) &&
     (bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(environment), !bVar2)) {
    this_00 = &diff_1.diff._M_t._M_impl.super__Rb_tree_header._M_node_count;
    cmSystemTools::EnvDiff::EnvDiff((EnvDiff *)this_00);
    cmSystemTools::EnvDiff::AppendEnv((EnvDiff *)this_00,environment);
    cmSystemTools::EnvDiff::ApplyToCurrentEnv
              ((EnvDiff *)&diff_1.diff._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (ostringstream *)&diff.diff._M_t._M_impl.super__Rb_tree_header._M_node_count);
    cmSystemTools::EnvDiff::~EnvDiff
              ((EnvDiff *)&diff_1.diff._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  if ((environment_modification !=
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0) &&
     (bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(environment_modification), !bVar2)) {
    cmSystemTools::EnvDiff::EnvDiff((EnvDiff *)local_468);
    bVar2 = true;
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(environment_modification);
    envmod = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(environment_modification);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&envmod), bVar3) {
      envmod_00 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2);
      bVar3 = cmSystemTools::EnvDiff::ParseOperation((EnvDiff *)local_468,envmod_00);
      bVar2 = (bVar2 & bVar3) != 0;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    if (bVar2 != false) {
      cmSystemTools::EnvDiff::ApplyToCurrentEnv
                ((EnvDiff *)local_468,
                 (ostringstream *)&diff.diff._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    else {
      testTimeOut_local.__r._7_1_ = 0;
    }
    envLog.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
    envLog.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = bVar2 == false;
    cmSystemTools::EnvDiff::~EnvDiff((EnvDiff *)local_468);
    if (envLog.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) goto LAB_002c0d0c;
  }
  if ((this->UseAllocatedResources & 1U) == 0) {
    cmSystemTools::UnsetEnv("CTEST_RESOURCE_GROUP_COUNT");
    poVar6 = std::operator<<((ostream *)&diff.diff._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             "#CTEST_RESOURCE_GROUP_COUNT=");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range2_1);
    SetupResourcesEnvironment
              (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range2_1);
    __end2_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range2_1);
    var = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range2_1);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&var), bVar2) {
      local_4d0 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2_1);
      poVar6 = std::operator<<((ostream *)
                               &diff.diff._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               (string *)local_4d0);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2_1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2_1);
  }
  std::__cxx11::ostringstream::str();
  this_02 = &(this->TestResult).Environment;
  std::__cxx11::string::operator=((string *)this_02,local_4f0);
  std::__cxx11::string::~string(local_4f0);
  lVar7 = std::__cxx11::string::length();
  std::__cxx11::string::erase((ulong)this_02,lVar7 - 1);
  pcVar5 = std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::operator->
                     (&this->TestProcess);
  testTimeOut_local.__r._7_1_ =
       cmProcess::StartProcess
                 (pcVar5,&this->MultiTestHandler->Loop,
                  (vector<unsigned_long,_std::allocator<unsigned_long>_> *)timeout.__r);
  envLog.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
LAB_002c0d0c:
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)&diff.diff._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cmSystemTools::SaveRestoreEnvironment::~SaveRestoreEnvironment
            ((SaveRestoreEnvironment *)local_290);
  return (bool)(testTimeOut_local.__r._7_1_ & 1);
}

Assistant:

bool cmCTestRunTest::ForkProcess(
  cmDuration testTimeOut, bool explicitTimeout,
  std::vector<std::string>* environment,
  std::vector<std::string>* environment_modification,
  std::vector<size_t>* affinity)
{
  this->TestProcess->SetId(this->Index);
  this->TestProcess->SetWorkingDirectory(this->TestProperties->Directory);
  this->TestProcess->SetCommand(this->ActualCommand);
  this->TestProcess->SetCommandArguments(this->Arguments);

  // determine how much time we have
  cmDuration timeout = this->CTest->GetRemainingTimeAllowed();
  if (timeout != cmCTest::MaxDuration()) {
    timeout -= std::chrono::minutes(2);
  }
  if (this->CTest->GetTimeOut() > cmDuration::zero() &&
      this->CTest->GetTimeOut() < timeout) {
    timeout = this->CTest->GetTimeOut();
  }
  if (testTimeOut > cmDuration::zero() &&
      testTimeOut < this->CTest->GetRemainingTimeAllowed()) {
    timeout = testTimeOut;
  }
  // always have at least 1 second if we got to here
  if (timeout <= cmDuration::zero()) {
    timeout = std::chrono::seconds(1);
  }
  // handle timeout explicitly set to 0
  if (testTimeOut == cmDuration::zero() && explicitTimeout) {
    timeout = cmDuration::zero();
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     this->Index << ": "
                                 << "Test timeout computed to be: "
                                 << cmDurationTo<unsigned int>(timeout)
                                 << "\n",
                     this->TestHandler->GetQuiet());

  this->TestProcess->SetTimeout(timeout);

  cmSystemTools::SaveRestoreEnvironment sre;
  std::ostringstream envMeasurement;

  // We split processing ENVIRONMENT and ENVIRONMENT_MODIFICATION into two
  // phases to ensure that MYVAR=reset: in the latter phase resets to the
  // former phase's settings, rather than to the original environment.
  if (environment && !environment->empty()) {
    cmSystemTools::EnvDiff diff;
    diff.AppendEnv(*environment);
    diff.ApplyToCurrentEnv(&envMeasurement);
  }

  if (environment_modification && !environment_modification->empty()) {
    cmSystemTools::EnvDiff diff;
    bool env_ok = true;

    for (auto const& envmod : *environment_modification) {
      env_ok &= diff.ParseOperation(envmod);
    }

    if (!env_ok) {
      return false;
    }

    diff.ApplyToCurrentEnv(&envMeasurement);
  }

  if (this->UseAllocatedResources) {
    std::vector<std::string> envLog;
    this->SetupResourcesEnvironment(&envLog);
    for (auto const& var : envLog) {
      envMeasurement << var << std::endl;
    }
  } else {
    cmSystemTools::UnsetEnv("CTEST_RESOURCE_GROUP_COUNT");
    // Signify that this variable is being actively unset
    envMeasurement << "#CTEST_RESOURCE_GROUP_COUNT=" << std::endl;
  }

  this->TestResult.Environment = envMeasurement.str();
  // Remove last newline
  this->TestResult.Environment.erase(this->TestResult.Environment.length() -
                                     1);

  return this->TestProcess->StartProcess(this->MultiTestHandler.Loop,
                                         affinity);
}